

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

NOAALRITHeader lrit::getHeader<lrit::NOAALRITHeader>(Buffer *b,int pos)

{
  pointer puVar1;
  NOAALRITHeader NVar2;
  NOAALRITHeader NVar3;
  HeaderReader<lrit::NOAALRITHeader> local_28;
  
  local_28.b_ = b;
  local_28.p_ = pos;
  NVar2 = HeaderReader<lrit::NOAALRITHeader>::getHeader(&local_28);
  puVar1 = ((local_28.b_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  NVar3._0_4_ = NVar2._0_4_;
  NVar3.agencySignature = (char  [4])*(undefined4 *)(puVar1 + local_28.p_);
  NVar3._8_8_ = NVar2._8_8_ & 0xff00000000000000 | (ulong)puVar1[local_28.p_ + 10] << 0x30 |
                (ulong)(ushort)(*(ushort *)(puVar1 + (local_28.p_ + 8)) << 8 |
                               *(ushort *)(puVar1 + (local_28.p_ + 8)) >> 8) << 0x20 |
                (ulong)(ushort)(*(ushort *)(puVar1 + (local_28.p_ + 6)) << 8 |
                               *(ushort *)(puVar1 + (local_28.p_ + 6)) >> 8) << 0x10 |
                (ulong)(ushort)(*(ushort *)(puVar1 + (local_28.p_ + 4)) << 8 |
                               *(ushort *)(puVar1 + (local_28.p_ + 4)) >> 8);
  return NVar3;
}

Assistant:

NOAALRITHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<NOAALRITHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.agencySignature, sizeof(h.agencySignature));
  r.read(&h.productID);
  r.read(&h.productSubID);
  r.read(&h.parameter);
  r.read(&h.noaaSpecificCompression);
  return h;
}